

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1511.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uStack_30;
  long unmet;
  
  iVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1511.c"
                  ,0x20,iVar1,uVar2);
    return iVar1;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1511.c"
                  ,0x22);
    iVar1 = 0x7c;
    goto LAB_0010238d;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  uVar4 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2a,1);
    uVar4 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x21,1);
      uVar4 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x22,0x5d5a7a78);
        uVar4 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_perform(lVar3);
          if (iVar1 != 0) goto LAB_0010238d;
          curl_easy_getinfo(lVar3,0x200023,&unmet);
          if (unmet != 1) {
            iVar1 = 0x77;
            goto LAB_0010238d;
          }
          iVar1 = curl_easy_setopt(lVar3,0x22,1);
          uVar4 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_perform(lVar3);
            if (iVar1 == 0) {
              curl_easy_getinfo(lVar3,0x200023,&unmet);
              iVar1 = (unmet == 0) + 0x77;
            }
            goto LAB_0010238d;
          }
          uVar2 = curl_easy_strerror(iVar1);
          uStack_30 = 0x36;
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uStack_30 = 0x29;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uStack_30 = 0x26;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_30 = 0x25;
    }
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    uStack_30 = 0x24;
  }
  curl_mfprintf(uVar4,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1511.c"
                ,uStack_30,iVar1,uVar2);
LAB_0010238d:
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  long unmet;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_HEADER, 1L);
  easy_setopt(curl, CURLOPT_TIMECONDITION, (long)CURL_TIMECOND_IFMODSINCE);

  /* TIMEVALUE in the future */
  easy_setopt(curl, CURLOPT_TIMEVALUE, 1566210680L);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &unmet);
  if(unmet != 1L) {
    res = TEST_ERR_FAILURE; /* not correct */
    goto test_cleanup;
  }

  /* TIMEVALUE in the past */
  easy_setopt(curl, CURLOPT_TIMEVALUE, 1L);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &unmet);
  if(unmet != 0L) {
    res = TEST_ERR_FAILURE; /* not correct */
    goto test_cleanup;
  }

  res = TEST_ERR_SUCCESS; /* this is where we should be */

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}